

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cc
# Opt level: O3

feature * VW::get_features(vw *all,example *ec,size_t *feature_map_len)

{
  uint32_t *puVar1;
  uint64_t *puVar2;
  bool bVar3;
  features_and_source local_48;
  
  bVar3 = (all->weights).sparse != false;
  puVar1 = &(all->weights).dense_weights._stride_shift;
  if (bVar3) {
    puVar1 = &(all->weights).sparse_weights._stride_shift;
  }
  local_48.stride_shift = *puVar1;
  puVar2 = &(all->weights).dense_weights._weight_mask;
  if (bVar3) {
    puVar2 = &(all->weights).sparse_weights._weight_mask;
  }
  local_48.mask = *puVar2 >> ((byte)local_48.stride_shift & 0x3f);
  local_48.feature_map._begin = (feature *)0x0;
  local_48.feature_map._end = (feature *)0x0;
  local_48.feature_map.end_array = (feature *)0x0;
  local_48.feature_map.erase_count = 0;
  GD::foreach_feature<features_and_source,_unsigned_long,_&vec_store>(all,ec,&local_48);
  *feature_map_len = (long)local_48.feature_map._end - (long)local_48.feature_map._begin >> 4;
  return local_48.feature_map._begin;
}

Assistant:

feature* get_features(vw& all, example* ec, size_t& feature_map_len)
{
  features_and_source fs;
  fs.stride_shift = all.weights.stride_shift();
  fs.mask = (uint64_t)all.weights.mask() >> all.weights.stride_shift();
  fs.feature_map = v_init<feature>();
  GD::foreach_feature<features_and_source, uint64_t, vec_store>(all, *ec, fs);

  feature_map_len = fs.feature_map.size();
  return fs.feature_map.begin();
}